

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O2

void __thiscall
slang::analysis::AnalysisScopeVisitor::visit
          (AnalysisScopeVisitor *this,WildcardImportSymbol *symbol)

{
  SyntaxNode *node;
  bool bVar1;
  pair<bool,_bool> pVar2;
  
  if ((((this->manager->options).flags.m_bits & 1) != 0) &&
     (node = (symbol->super_Symbol).originatingSyntax, node != (SyntaxNode *)0x0)) {
    pVar2 = isReferenced(this,node);
    if (((ushort)pVar2 & 1) == 0) {
      bVar1 = shouldWarn(this,&symbol->super_Symbol);
      if (bVar1) {
        Diagnostics::add(&this->context->diagnostics,&symbol->super_Symbol,(DiagCode)0x2a000e,
                         (symbol->super_Symbol).location);
        return;
      }
    }
  }
  return;
}

Assistant:

void visit(const WildcardImportSymbol& symbol) {
        if (!manager.hasFlag(AnalysisFlags::CheckUnused))
            return;

        auto syntax = symbol.getSyntax();
        if (!syntax)
            return;

        auto [used, _] = isReferenced(*syntax);
        if (!used) {
            if (shouldWarn(symbol))
                context.addDiag(symbol, diag::UnusedWildcardImport, symbol.location);
        }
    }